

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int automataTest(char *filename,char *result,char *err,int options)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  FILE *__s;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  char *extraout_RDX;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  char expr [5000];
  xmlAutomataStatePtr states [1000];
  char acStack_3770 [499];
  undefined1 uStack_357d;
  char acStack_3570 [512];
  char *pcStack_3370;
  char *pcStack_3368;
  long local_3338;
  long local_3330;
  undefined8 local_3310;
  char local_3308 [5008];
  long local_1f78 [1001];
  
  nb_tests = nb_tests + 1;
  memset(local_1f78,0,8000);
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    pcVar15 = "";
    pcVar7 = filename;
    pcVar5 = resultFilename(filename,"",".res");
    if (pcVar5 == (char *)0x0) {
      automataTest_cold_5();
      pcStack_3370 = filename;
      pcStack_3368 = result;
      pcVar5 = baseFilename(pcVar7);
      pcVar7 = ".tmp";
      if (extraout_RDX != (char *)0x0) {
        pcVar7 = extraout_RDX;
      }
      pcVar14 = "";
      if (pcVar15 != (char *)0x0) {
        pcVar14 = pcVar15;
      }
      strncpy(acStack_3570,pcVar7,499);
      iVar4 = snprintf(acStack_3770,499,"%s%s%s",pcVar14,pcVar5,acStack_3570);
      if (0x1f2 < iVar4) {
        uStack_357d = 0;
      }
      pcVar7 = strdup(acStack_3770);
      return (int)pcVar7;
    }
    __s = fopen64(pcVar5,"wb");
    if (__s == (FILE *)0x0) {
      automataTest_cold_4();
    }
    else {
      lVar6 = xmlNewAutomata();
      if (lVar6 == 0) {
        automataTest_cold_3();
      }
      else {
        local_1f78[0] = xmlAutomataGetInitState(lVar6);
        if (local_1f78[0] != 0) {
          local_3338 = 0;
          local_3330 = 0;
          local_3310 = result;
LAB_0010be2b:
          iVar4 = 0;
LAB_0010be34:
          do {
            do {
              pcVar7 = fgets(local_3308,0x1194,__stream);
              cVar2 = local_3308[0];
              if (pcVar7 == (char *)0x0) {
LAB_0010c51b:
                fclose(__s);
                fclose(__stream);
                if (local_3330 != 0) {
                  xmlRegFreeRegexp();
                }
                pcVar7 = local_3310;
                if (local_3338 != 0) {
                  xmlRegFreeExecCtxt();
                }
                if (lVar6 != 0) {
                  xmlFreeAutomata(lVar6);
                }
                iVar4 = compareFiles(pcVar5,pcVar7);
                if (iVar4 != 0) {
                  fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar7);
                }
                unlink(pcVar5);
                free(pcVar5);
                return (uint)(iVar4 != 0);
              }
            } while (local_3308[0] == '#');
            sVar8 = strlen(local_3308);
            if (0 < (int)(uint)sVar8) {
              uVar9 = (ulong)((uint)sVar8 & 0x7fffffff);
              while (((ulong)(byte)local_3308[uVar9 - 1] < 0x21 &&
                     ((0x100002600U >> ((ulong)(byte)local_3308[uVar9 - 1] & 0x3f) & 1) != 0))) {
                sVar8 = uVar9 - 1;
                bVar1 = (long)uVar9 < 2;
                uVar9 = sVar8;
                if (bVar1) goto LAB_0010be87;
              }
              local_3308[uVar9 & 0xffffffff] = '\0';
              bVar12 = local_3308[1] ^ 0x20;
              if ((cVar2 == 't' && bVar12 == 0) && lVar6 != 0) {
                if ((byte)(local_3308[2] - 0x30U) < 10) {
                  iVar13 = 0;
                  pcVar7 = local_3308 + 2;
                  cVar2 = local_3308[2];
                  do {
                    iVar13 = (uint)(byte)(cVar2 - 0x30) + iVar13 * 10;
                    cVar2 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                  } while ((byte)(cVar2 - 0x30U) < 10);
                  lVar16 = (long)iVar13;
                }
                else {
                  lVar16 = 0;
                  pcVar7 = local_3308 + 2;
                }
                if (*pcVar7 == ' ') {
                  if (local_1f78[lVar16] == 0) {
                    lVar10 = xmlAutomataNewState(lVar6);
                    local_1f78[lVar16] = lVar10;
                  }
                  cVar2 = pcVar7[1];
                  pcVar7 = pcVar7 + 1;
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    iVar13 = 0;
                    do {
                      iVar13 = (uint)(byte)(cVar2 - 0x30) + iVar13 * 10;
                      cVar2 = pcVar7[1];
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                    lVar10 = (long)iVar13;
                  }
                  else {
                    lVar10 = 0;
                  }
                  if (*pcVar7 == ' ') {
                    if (local_1f78[lVar10] == 0) {
                      lVar11 = xmlAutomataNewState(lVar6);
                      local_1f78[lVar10] = lVar11;
                    }
                    xmlAutomataNewTransition(lVar6,local_1f78[lVar16],local_1f78[lVar10],pcVar7 + 1)
                    ;
                    goto LAB_0010be34;
                  }
                }
              }
              else {
                if ((cVar2 == 'e' && bVar12 == 0) && lVar6 != 0) {
                  if ((byte)(local_3308[2] - 0x30U) < 10) {
                    iVar13 = 0;
                    pcVar7 = local_3308 + 2;
                    cVar2 = local_3308[2];
                    do {
                      iVar13 = (uint)(byte)(cVar2 - 0x30) + iVar13 * 10;
                      cVar2 = pcVar7[1];
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                    lVar16 = (long)iVar13;
                  }
                  else {
                    lVar16 = 0;
                    pcVar7 = local_3308 + 2;
                  }
                  cVar2 = *pcVar7;
                  if (cVar2 == ' ') {
                    if (local_1f78[lVar16] == 0) {
                      lVar10 = xmlAutomataNewState(lVar6);
                      local_1f78[lVar16] = lVar10;
                    }
                    cVar3 = pcVar7[1];
                    if ((byte)(cVar3 - 0x30U) < 10) {
                      pcVar7 = pcVar7 + 2;
                      iVar13 = 0;
                      do {
                        iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                        cVar3 = *pcVar7;
                        pcVar7 = pcVar7 + 1;
                      } while ((byte)(cVar3 - 0x30U) < 10);
                      lVar10 = (long)iVar13;
                    }
                    else {
                      lVar10 = 0;
                    }
                    if (local_1f78[lVar10] == 0) {
                      lVar11 = xmlAutomataNewState(lVar6);
                      local_1f78[lVar10] = lVar11;
                    }
                    xmlAutomataNewEpsilon(lVar6,local_1f78[lVar16],local_1f78[lVar10]);
                  }
                  else {
                    fprintf(_stderr,"Bad line %s\n",local_3308);
                  }
                  if (cVar2 != ' ') goto LAB_0010c51b;
                  goto LAB_0010be34;
                }
                if ((cVar2 == 'f' && bVar12 == 0) && lVar6 != 0) {
                  uVar9 = 0;
                  if ((byte)(local_3308[2] - 0x30U) < 10) {
                    uVar9 = 0;
                    pcVar7 = local_3308 + 3;
                    cVar2 = local_3308[2];
                    do {
                      uVar9 = (ulong)((uint)(byte)(cVar2 - 0x30) + (int)uVar9 * 10);
                      cVar2 = *pcVar7;
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                  }
                  if (local_1f78[(int)uVar9] == 0) {
                    fprintf(_stderr,"Bad state %d : %s\n",uVar9,local_3308);
                    goto LAB_0010c51b;
                  }
                  xmlAutomataSetFinalState(lVar6,local_1f78[(int)uVar9]);
                  goto LAB_0010be34;
                }
                if ((cVar2 != 'c' || bVar12 != 0) || lVar6 == 0) {
                  if ((local_3308[1] == 0x2d && cVar2 == '-') && lVar6 != 0) {
                    local_3330 = xmlAutomataCompile(lVar6);
                    xmlFreeAutomata(lVar6);
                    lVar6 = 0;
                    if (local_3330 != 0) goto LAB_0010be34;
                    automataTest_cold_1();
                    local_3330 = 0;
                    lVar6 = 0;
                    goto LAB_0010c51b;
                  }
                  if (local_3308[1] == 0x3e && cVar2 == '=') {
                    if (local_3330 == 0) {
                      fwrite("=> failed not compiled\n",0x17,1,__s);
                    }
                    else {
                      if (local_3338 == 0) {
                        local_3338 = xmlRegNewExecCtxt(local_3330,0,0);
                      }
                      if (iVar4 == 0) {
                        iVar4 = xmlRegExecPushString(local_3338,0,0);
                      }
                      if (iVar4 == 1) {
                        sVar8 = 10;
                        pcVar7 = "=> Passed\n";
LAB_0010c497:
                        fwrite(pcVar7,sVar8,1,__s);
                      }
                      else {
                        if (iVar4 + 1U < 2) {
                          sVar8 = 10;
                          pcVar7 = "=> Failed\n";
                          goto LAB_0010c497;
                        }
                        if (iVar4 < 0) {
                          sVar8 = 9;
                          pcVar7 = "=> Error\n";
                          goto LAB_0010c497;
                        }
                      }
                      xmlRegFreeExecCtxt(local_3338);
                      local_3338 = 0;
                    }
                    goto LAB_0010be2b;
                  }
                  if (local_3330 == 0) {
                    fprintf(_stderr,"Unexpected line %s\n",local_3308);
                    local_3330 = 0;
                  }
                  else {
                    if (local_3338 == 0) {
                      local_3338 = xmlRegNewExecCtxt(local_3330,0,0);
                    }
                    iVar4 = xmlRegExecPushString(local_3338,local_3308,0);
                  }
                  goto LAB_0010be34;
                }
                if ((byte)(local_3308[2] - 0x30U) < 10) {
                  iVar13 = 0;
                  pcVar7 = local_3308 + 2;
                  cVar2 = local_3308[2];
                  do {
                    iVar13 = (uint)(byte)(cVar2 - 0x30) + iVar13 * 10;
                    cVar2 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                  } while ((byte)(cVar2 - 0x30U) < 10);
                  lVar16 = (long)iVar13;
                }
                else {
                  lVar16 = 0;
                  pcVar7 = local_3308 + 2;
                }
                if (*pcVar7 != ' ') goto LAB_0010c4fe;
                if (local_1f78[lVar16] == 0) {
                  lVar10 = xmlAutomataNewState(lVar6);
                  local_1f78[lVar16] = lVar10;
                }
                cVar2 = pcVar7[1];
                pcVar7 = pcVar7 + 1;
                if ((byte)(cVar2 - 0x30U) < 10) {
                  iVar13 = 0;
                  do {
                    iVar13 = (uint)(byte)(cVar2 - 0x30) + iVar13 * 10;
                    cVar2 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                  } while ((byte)(cVar2 - 0x30U) < 10);
                  lVar10 = (long)iVar13;
                }
                else {
                  lVar10 = 0;
                }
                if (*pcVar7 == ' ') {
                  if (local_1f78[lVar10] == 0) {
                    lVar11 = xmlAutomataNewState(lVar6);
                    local_1f78[lVar10] = lVar11;
                  }
                  cVar2 = pcVar7[1];
                  pcVar7 = pcVar7 + 1;
                  iVar13 = 0;
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    iVar13 = 0;
                    do {
                      iVar13 = (uint)(byte)(cVar2 - 0x30) + iVar13 * 10;
                      cVar2 = pcVar7[1];
                      pcVar7 = pcVar7 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                  }
                  if (*pcVar7 == ' ') {
                    cVar2 = pcVar7[1];
                    pcVar7 = pcVar7 + 1;
                    iVar17 = 0;
                    if ((byte)(cVar2 - 0x30U) < 10) {
                      iVar17 = 0;
                      do {
                        iVar17 = (uint)(byte)(cVar2 - 0x30) + iVar17 * 10;
                        cVar2 = pcVar7[1];
                        pcVar7 = pcVar7 + 1;
                      } while ((byte)(cVar2 - 0x30U) < 10);
                    }
                    if (*pcVar7 == ' ') {
                      xmlAutomataNewCountTrans
                                (lVar6,local_1f78[lVar16],local_1f78[lVar10],pcVar7 + 1,iVar13,
                                 iVar17);
                      goto LAB_0010be34;
                    }
                  }
                }
              }
LAB_0010c4fe:
              fprintf(_stderr,"Bad line %s\n",local_3308);
              goto LAB_0010c51b;
            }
LAB_0010be87:
            local_3308[(int)sVar8] = '\0';
          } while( true );
        }
        automataTest_cold_2();
      }
    }
  }
  return -1;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        fprintf(stderr,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        fprintf(stderr,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    fprintf(stderr,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    fprintf(stderr,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		fprintf(stderr,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}